

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::callable>::
holder<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
          (holder<cs::callable> *this,
          _func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *args,types *args_1)

{
  baseHolder *in_RDI;
  function_type *func;
  callable *this_00;
  callable local_38;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006c2f10;
  func = (function_type *)(in_RDI + 1);
  this_00 = &local_38;
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),void>
            (&this_00->mFunc,
             (_func_any_vector<cs_impl::any,_std::allocator<cs_impl::any>_>_ptr *)func);
  cs::callable::callable(this_00,func,(types)((ulong)in_RDI >> 0x20));
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
            0x55ade4);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}